

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bm_utils.c
# Opt level: O0

int pick_str(distribution *s,int c,char *target)

{
  char *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  long j;
  long i;
  long in_stack_ffffffffffffffd8;
  long lVar1;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = 0;
  dss_random((long *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(long)in_RDX,0,
             in_stack_ffffffffffffffd8);
  for (; *(long *)(*(long *)(in_RDI + 8) + lVar1 * 0x10) < in_stack_ffffffffffffffd8;
      lVar1 = lVar1 + 1) {
  }
  strcpy(in_RDX,*(char **)(*(long *)(in_RDI + 8) + lVar1 * 0x10 + 8));
  return (int)lVar1;
}

Assistant:

int
pick_str(distribution *s, int c, char *target)
{
    long      i = 0;
    long      j;

    RANDOM(j, 1, s->list[s->count - 1].weight, c);
    while (s->list[i].weight < j)
        i++;
    strcpy(target, s->list[i].text);
    return(i);
}